

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_chdir(char *file,wchar_t line,char *pathname)

{
  int iVar1;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = chdir(in_RDX);
  if (iVar1 != 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"chdir(\"%s\")",in_RDX);
    failure_finish((void *)0x1059ae);
  }
  local_4 = (wchar_t)(iVar1 == 0);
  return local_4;
}

Assistant:

int
assertion_chdir(const char *file, int line, const char *pathname)
{
	assertion_count(file, line);
	if (chdir(pathname) == 0)
		return (1);
	failure_start(file, line, "chdir(\"%s\")", pathname);
	failure_finish(NULL);
	return (0);

}